

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fuzz.c
# Opt level: O3

void test_fuzz(files *filesets)

{
  char *__size;
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  int iVar4;
  archive *paVar5;
  char *__src;
  char ***__ptr;
  void *__dest;
  time_t tVar6;
  FILE *__s;
  size_t v2;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  char **names;
  char ***pppcVar11;
  char *pcVar12;
  bool bVar13;
  size_t size;
  archive_entry *ae;
  int64_t blk_offset;
  size_t blk_size;
  void *blk;
  char *local_70;
  char ***local_68;
  files *local_60;
  archive_entry *local_58;
  long local_50;
  int64_t local_48;
  size_t local_40;
  void *local_38;
  
  names = filesets->names;
  if (names != (char **)0x0) {
    pppcVar11 = &filesets->names;
    lVar9 = 0;
    local_60 = filesets;
    do {
      local_70 = (char *)0x0;
      local_50 = lVar9;
      extract_reference_files(names);
      if (filesets[lVar9].uncompress == 0) {
        pcVar10 = **pppcVar11;
        if (pcVar10 == (char *)0x0) {
          __ptr = (char ***)(void *)0x0;
        }
        else {
          lVar9 = 8;
          __ptr = (char ***)0x0;
          pcVar12 = (char *)0x0;
          local_68 = pppcVar11;
          do {
            __src = slurpfile((size_t *)&local_70,pcVar10);
            pcVar10 = local_70;
            __size = local_70 + (long)pcVar12;
            __ptr = (char ***)realloc(__ptr,(size_t)__size);
            memcpy(pcVar12 + (long)__ptr,__src,(size_t)pcVar10);
            local_70 = __size;
            free(__src);
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                             ,L'v',(uint)(__ptr != (char ***)0x0),"rawimage != NULL",(void *)0x0);
            pcVar10 = *(char **)((long)*local_68 + lVar9);
            lVar9 = lVar9 + 8;
            pcVar12 = __size;
          } while (pcVar10 != (char *)0x0);
        }
LAB_00143a3d:
        filesets = local_60;
        local_68 = __ptr;
        if (local_70 != (char *)0x0) {
          __dest = malloc((size_t)local_70);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'}',(uint)(__dest != (void *)0x0),"image != NULL",(void *)0x0);
          if (__dest == (void *)0x0) {
            return;
          }
          iVar1 = 0;
          tVar6 = time((time_t *)0x0);
          srand((uint)tVar6);
          do {
            pcVar10 = local_70;
            memcpy(__dest,local_68,(size_t)local_70);
            iVar4 = (int)pcVar10 / 100;
            if ((int)pcVar10 + 99U < 199) {
              iVar4 = 1;
            }
            iVar3 = rand();
            if (0 < (int)((long)iVar3 % (long)iVar4)) {
              uVar8 = (long)iVar3 % (long)iVar4 & 0xffffffff;
              do {
                iVar4 = rand();
                iVar3 = rand();
                *(char *)((long)__dest + (ulong)(long)iVar3 % (ulong)local_70) = (char)iVar4;
                uVar7 = (int)uVar8 - 1;
                uVar8 = (ulong)uVar7;
              } while (uVar7 != 0);
            }
            iVar4 = 2;
            do {
              __s = fopen("after.test.failure.send.this.file.to.libarchive.maintainers.with.system.details"
                          ,"wb");
              pcVar10 = local_70;
              bVar13 = iVar4 != 0;
              iVar4 = iVar4 + -1;
              if (__s != (FILE *)0x0) break;
            } while (bVar13);
            v2 = fwrite(__dest,1,(size_t)local_70,__s);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'\x9e',(longlong)pcVar10,"(size_t)size",v2,
                                "fwrite(image, 1, (size_t)size, f)",(void *)0x0);
            fclose(__s);
            paVar5 = archive_read_new();
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                             ,L'¡',(uint)(paVar5 != (archive *)0x0),
                             "(a = archive_read_new()) != NULL",(void *)0x0);
            iVar4 = archive_read_support_filter_all(paVar5);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'£',0,"ARCHIVE_OK",(long)iVar4,
                                "archive_read_support_filter_all(a)",paVar5);
            iVar4 = archive_read_support_format_all(paVar5);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                                ,L'¥',0,"ARCHIVE_OK",(long)iVar4,
                                "archive_read_support_format_all(a)",paVar5);
            iVar4 = archive_read_open_memory(paVar5,__dest,(size_t)local_70);
            if (iVar4 == 0) {
              while (iVar4 = archive_read_next_header(paVar5,&local_58), iVar4 == 0) {
                do {
                  iVar4 = archive_read_data_block(paVar5,&local_38,&local_40,&local_48);
                } while (iVar4 == 0);
              }
              archive_read_close(paVar5);
            }
            archive_read_free(paVar5);
            iVar1 = iVar1 + 1;
          } while (iVar1 != 100);
          free(__dest);
          free(local_68);
          filesets = local_60;
        }
      }
      else {
        paVar5 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'J',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar1 = archive_read_support_filter_all(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'L',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                            paVar5);
        iVar1 = archive_read_support_format_raw(paVar5);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'N',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",
                            paVar5);
        wVar2 = archive_read_open_filenames(paVar5,*pppcVar11,0x4000);
        if (wVar2 == L'\0') {
          iVar1 = archive_read_next_header(paVar5,&local_58);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'Z',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                              paVar5);
          local_68 = (char ***)malloc(30000000);
          local_70 = (char *)archive_read_data(paVar5,local_68,30000000);
          iVar1 = archive_read_next_header(paVar5,&local_58);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'^',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                              paVar5);
          iVar1 = archive_read_free(paVar5);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'`',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'a',(uint)(local_70 != (char *)0x0),"size > 0",(void *)0x0);
          if ((**pppcVar11 == (char *)0x0) || ((*pppcVar11)[1] == (char *)0x0)) {
            failure("Internal buffer is not big enough for uncompressed test files");
          }
          else {
            failure("Internal buffer is not big enough for uncompressed test file: %s");
          }
          wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                                   ,L'i',(uint)(local_70 < buff3 + 0x5e4810),"size < buffsize",
                                   (void *)0x0);
          __ptr = local_68;
          if (wVar2 != L'\0') goto LAB_00143a3d;
          free(local_68);
        }
        else {
          archive_read_free(paVar5);
          if ((**pppcVar11 == (char *)0x0) || ((*pppcVar11)[1] == (char *)0x0)) {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'S');
            test_skipping("Cannot uncompress fileset");
          }
          else {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'U');
            test_skipping("Cannot uncompress %s",**pppcVar11);
          }
        }
      }
      lVar9 = local_50 + 1;
      pppcVar11 = &filesets[lVar9].names;
      names = *pppcVar11;
    } while (names != (char **)0x0);
  }
  return;
}

Assistant:

static void
test_fuzz(const struct files *filesets)
{
	const void *blk;
	size_t blk_size;
	int64_t blk_offset;
	int n;

	for (n = 0; filesets[n].names != NULL; ++n) {
		const size_t buffsize = 30000000;
		struct archive_entry *ae;
		struct archive *a;
		char *rawimage = NULL, *image = NULL, *tmp = NULL;
		size_t size = 0, oldsize = 0;
		int i, q;

		extract_reference_files(filesets[n].names);
		if (filesets[n].uncompress) {
			int r;
			/* Use format_raw to decompress the data. */
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_raw(a));
			r = archive_read_open_filenames(a, filesets[n].names, 16384);
			if (r != ARCHIVE_OK) {
				archive_read_free(a);
				if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
					skipping("Cannot uncompress fileset");
				} else {
					skipping("Cannot uncompress %s", filesets[n].names[0]);
				}
				continue;
			}
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			rawimage = malloc(buffsize);
			size = archive_read_data(a, rawimage, buffsize);
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_next_header(a, &ae));
			assertEqualInt(ARCHIVE_OK,
			    archive_read_free(a));
			assert(size > 0);
			if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
				failure("Internal buffer is not big enough for "
					"uncompressed test files");
			} else {
				failure("Internal buffer is not big enough for "
					"uncompressed test file: %s", filesets[n].names[0]);
			}
			if (!assert(size < buffsize)) {
				free(rawimage);
				continue;
			}
		} else {
			for (i = 0; filesets[n].names[i] != NULL; ++i)
			{
				tmp = slurpfile(&size, filesets[n].names[i]);
				rawimage = (char *)realloc(rawimage, oldsize + size);
				memcpy(rawimage + oldsize, tmp, size);
				oldsize += size;
				size = oldsize;
				free(tmp);
				if (!assert(rawimage != NULL))
					continue;
			}
		}
		if (size == 0)
			continue;
		image = malloc(size);
		assert(image != NULL);
		if (image == NULL)
			return;
		srand((unsigned)time(NULL));

		for (i = 0; i < 100; ++i) {
			FILE *f;
			int j, numbytes, trycnt;

			/* Fuzz < 1% of the bytes in the archive. */
			memcpy(image, rawimage, size);
			q = (int)size / 100;
			if (!q) q = 1;
			numbytes = (int)(rand() % q);
			for (j = 0; j < numbytes; ++j)
				image[rand() % size] = (char)rand();

			/* Save the messed-up image to a file.
			 * If we crash, that file will be useful. */
			for (trycnt = 0; trycnt < 3; trycnt++) {
				f = fopen("after.test.failure.send.this.file."
				    "to.libarchive.maintainers.with.system.details", "wb");
				if (f != NULL)
					break;
#if defined(_WIN32) && !defined(__CYGWIN__)
				/*
				 * Sometimes previous close operation does not completely
				 * end at this time. So we should take a wait while
				 * the operation running.
				 */
				Sleep(100);
#endif
			}
			assertEqualInt((size_t)size, fwrite(image, 1, (size_t)size, f));
			fclose(f);

			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
					while (0 == archive_read_data_block(a,
						&blk, &blk_size, &blk_offset))
						continue;
				}
				archive_read_close(a);
			}
			archive_read_free(a);
		}
		free(image);
		free(rawimage);
	}
}